

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int nni_chunk_trim(nni_chunk *ch,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  if (ch->ch_len < len) {
    iVar1 = 3;
  }
  else {
    sVar2 = ch->ch_len - len;
    ch->ch_len = sVar2;
    iVar1 = 0;
    if (sVar2 != 0) {
      ch->ch_ptr = ch->ch_ptr + len;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
nni_chunk_trim(nni_chunk *ch, size_t len)
{
	if (ch->ch_len < len) {
		return (NNG_EINVAL);
	}
	ch->ch_len -= len;
	// Don't advance the pointer if we are just removing the whole content
	if (ch->ch_len != 0) {
		ch->ch_ptr += len;
	}
	return (0);
}